

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O0

avl_node * avl_first(avl_tree *tree)

{
  avl_node *node;
  avl_node *p;
  avl_tree *tree_local;
  
  p = (avl_node *)0x0;
  for (node = tree->root; node != (avl_node *)0x0; node = node->left) {
    p = node;
  }
  return p;
}

Assistant:

struct avl_node* avl_first(struct avl_tree *tree)
{
    struct avl_node *p = NULL;
    struct avl_node *node = tree->root;

    while(node) {
        p = node;
        node = node->left;
    }
    return p;
}